

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

cram_codec *
cram_byte_array_stop_encode_init(cram_stats *st,cram_external_type option,void *dat,int version)

{
  cram_codec *pcVar1;
  
  pcVar1 = (cram_codec *)malloc(0x240);
  if (pcVar1 != (cram_codec *)0x0) {
    pcVar1->codec = E_BYTE_ARRAY_STOP;
    pcVar1->free = cram_byte_array_stop_encode_free;
    pcVar1->encode = cram_byte_array_stop_encode;
    pcVar1->store = cram_byte_array_stop_encode_store;
    (pcVar1->field_6).byte_array_stop.stop = *dat;
    (pcVar1->field_6).external.type = *(cram_external_type *)((long)dat + 4);
  }
  return pcVar1;
}

Assistant:

cram_codec *cram_byte_array_stop_encode_init(cram_stats *st,
					     enum cram_external_type option,
					     void *dat,
					     int version) {
    cram_codec *c;

    c = malloc(sizeof(*c));
    if (!c)
	return NULL;
    c->codec = E_BYTE_ARRAY_STOP;
    c->free = cram_byte_array_stop_encode_free;
    c->encode = cram_byte_array_stop_encode;
    c->store = cram_byte_array_stop_encode_store;

    c->e_byte_array_stop.stop = ((int *)dat)[0];
    c->e_byte_array_stop.content_id = ((int *)dat)[1];

    return c;
}